

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

void __thiscall HMatrix::price_by_col(HMatrix *this,HVector *row_ap,HVector *row_ep)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  
  if (this->numCol < 1) {
    iVar9 = 0;
  }
  else {
    piVar3 = (row_ap->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (row_ap->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    iVar9 = 0;
    do {
      iVar1 = piVar6[lVar10];
      lVar11 = (long)iVar1;
      iVar2 = piVar6[lVar10 + 1];
      dVar12 = 0.0;
      if (iVar1 < iVar2) {
        do {
          dVar12 = dVar12 + pdVar5[piVar7[lVar11]] * pdVar8[lVar11];
          lVar11 = lVar11 + 1;
        } while (iVar2 != lVar11);
      }
      if (1e-14 < ABS(dVar12)) {
        pdVar4[lVar10] = dVar12;
        lVar11 = (long)iVar9;
        iVar9 = iVar9 + 1;
        piVar3[lVar11] = (int)lVar10;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numCol);
  }
  row_ap->count = iVar9;
  return;
}

Assistant:

void HMatrix::price_by_col(HVector& row_ap, HVector& row_ep) const {
    // Alias
    int ap_count = 0;
    int *ap_index = &row_ap.index[0];
    double *ap_array = &row_ap.array[0];
    const double *ep_array = &row_ep.array[0];

    // Computation
    for (int iCol = 0; iCol < numCol; iCol++) {
        double value = 0;
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            value += ep_array[Aindex[k]] * Avalue[k];
        }
        if (fabs(value) > HSOL_CONST_TINY) {
            ap_array[iCol] = value;
            ap_index[ap_count++] = iCol;
        }
    }
    row_ap.count = ap_count;

}